

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_step(sqlite3_stmt *pStmt)

{
  char cVar1;
  undefined8 *puVar2;
  long lVar3;
  sqlite3 *psVar4;
  Vdbe *pVVar5;
  undefined8 *puVar6;
  int iVar7;
  long *plVar8;
  Vdbe *pFromStmt;
  Mem *pMVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long *plVar13;
  char *pcVar14;
  ushort uVar15;
  uint uVar16;
  char *z2_1;
  Mem *pMVar17;
  Mem *pMVar18;
  undefined8 uVar19;
  char *z2;
  long *plVar20;
  char *pcVar21;
  char *pcVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  Mem *pMVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  Mem *pMVar31;
  byte *pbVar32;
  Vdbe *p;
  sqlite3_stmt *pNew;
  Vdbe *local_198;
  undefined8 local_190;
  Mem *local_188;
  Mem *local_180;
  int local_174;
  long local_170;
  char *local_168;
  byte *local_160;
  sqlite3 *local_158;
  sqlite3_stmt *local_150;
  sqlite3_stmt *local_148;
  long local_140 [34];
  
  iVar10 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar10 == 0) {
    local_158 = *(sqlite3 **)pStmt;
    if (local_158->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(local_158->mutex);
    }
    uVar15 = *(ushort *)(pStmt + 0x9a) & 0xfbff;
    local_150 = pStmt + 0xb8;
    local_148 = pStmt + 0x58;
    iVar10 = 0;
LAB_0014d3a1:
    *(ushort *)(pStmt + 0x9a) = uVar15;
    if (*(int *)(pStmt + 0x50) != -0x420df25d) {
      sqlite3_reset(pStmt);
    }
    puVar2 = *(undefined8 **)pStmt;
    if (*(char *)(puVar2 + 10) != '\0') {
      *(undefined4 *)(pStmt + 0x94) = 7;
      uVar12 = 7;
      goto LAB_0014d73b;
    }
    if ((*(int *)(pStmt + 0x90) < 1) && (((byte)pStmt[0x9a] & 0x20) != 0)) {
      *(undefined4 *)(pStmt + 0x94) = 0x11;
      uVar12 = 1;
      goto LAB_0014d714;
    }
    if (*(int *)(pStmt + 0x90) < 0) {
      if (*(int *)((long)puVar2 + 0x9c) == 0) {
        *(undefined4 *)(puVar2 + 0x29) = 0;
      }
      if ((puVar2[0x19] != 0) && (*(char *)((long)puVar2 + 0x99) == '\0')) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,(sqlite3_int64 *)local_150);
      }
      *(int *)((long)puVar2 + 0x9c) = *(int *)((long)puVar2 + 0x9c) + 1;
      if (((byte)pStmt[0x9b] & 1) == 0) {
        *(int *)(puVar2 + 0x14) = *(int *)(puVar2 + 0x14) + 1;
      }
      *(undefined4 *)(pStmt + 0x90) = 0;
    }
    if (((byte)pStmt[0x9a] & 3) == 0) {
      *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + 1;
      uVar12 = sqlite3VdbeExec((Vdbe *)pStmt);
      *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + -1;
      goto LAB_0014d5f4;
    }
    psVar4 = *(sqlite3 **)pStmt;
    lVar24 = *(long *)(pStmt + 0x10);
    pMVar27 = (Mem *)(lVar24 + 0x38);
    releaseMemArray(pMVar27,8);
    *(undefined8 *)(pStmt + 0x28) = 0;
    if (*(int *)(pStmt + 0x94) == 7) {
      psVar4->mallocFailed = '\x01';
LAB_0014d5d6:
      uVar12 = 1;
      goto LAB_0014d5f4;
    }
    iVar11 = *(int *)(pStmt + 0x34);
    uVar15 = *(ushort *)(pStmt + 0x9a) & 3;
    iVar26 = iVar11;
    if (uVar15 == 1) {
      lVar30 = *(long *)(pStmt + 0x10);
      if ((*(byte *)(lVar30 + 0x21c) & 0x10) == 0) {
        plVar13 = (long *)0x0;
        uVar12 = 0;
      }
      else {
        uVar12 = *(int *)(lVar30 + 0x218) >> 3;
        plVar13 = *(long **)(lVar30 + 0x200);
      }
      local_188 = (Mem *)(lVar30 + 0x1f8);
      if (0 < (int)uVar12) {
        uVar28 = 0;
        do {
          iVar26 = iVar26 + *(int *)(plVar13[uVar28] + 8);
          uVar28 = uVar28 + 1;
        } while (uVar12 != uVar28);
      }
    }
    else {
      plVar13 = (long *)0x0;
      local_188 = (Mem *)0x0;
      uVar12 = 0;
    }
    pMVar9 = local_188;
    local_180 = (Mem *)(ulong)uVar12;
    uVar28 = (ulong)*(int *)(pStmt + 0x90);
    lVar30 = uVar28 * 0x18;
    lVar3 = uVar28 << 0x20;
    do {
      lVar29 = lVar3;
      uVar25 = uVar28;
      if ((uVar15 != 2) || ((long)iVar26 <= (long)uVar25)) break;
      pcVar14 = (char *)(*(long *)(pStmt + 8) + lVar30);
      lVar30 = lVar30 + 0x18;
      uVar28 = uVar25 + 1;
      lVar3 = lVar29 + 0x100000000;
    } while (*pcVar14 != -0x6a);
    iVar7 = (int)uVar25;
    *(int *)(pStmt + 0x90) = iVar7 + 1;
    local_190 = pMVar27;
    if ((long)iVar26 <= (long)uVar25) {
      *(undefined4 *)(pStmt + 0x94) = 0;
      uVar12 = 0x65;
      goto LAB_0014d5f4;
    }
    if ((psVar4->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x94) = 9;
      sqlite3SetString((char **)local_148,psVar4,"%s");
      goto LAB_0014d5d6;
    }
    if (iVar7 < iVar11) {
      pbVar32 = (byte *)((lVar29 >> 0x20) * 0x18 + *(long *)(pStmt + 8));
    }
    else {
      uVar25 = (ulong)(uint)(iVar7 - iVar11);
      plVar20 = (long *)*plVar13;
      iVar26 = (int)plVar20[1];
      plVar8 = plVar13;
      if (iVar26 <= iVar7 - iVar11) {
        do {
          uVar16 = (int)uVar25 - iVar26;
          uVar25 = (ulong)uVar16;
          plVar20 = (long *)plVar8[1];
          iVar26 = (int)plVar20[1];
          plVar8 = plVar8 + 1;
        } while (iVar26 <= (int)uVar16);
      }
      pbVar32 = (byte *)((long)(int)uVar25 * 0x18 + *plVar20);
    }
    pMVar31 = pMVar27;
    if (uVar15 == 1) {
      *(undefined2 *)(lVar24 + 0x5c) = 4;
      *(undefined1 *)(lVar24 + 0x5e) = 1;
      *(long *)(lVar24 + 0x50) = (long)(int)uVar25;
      *(undefined2 *)(lVar24 + 0x94) = 0xa02;
      pcVar14 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar32 * 8);
      *(char **)(lVar24 + 0x78) = pcVar14;
      uVar16 = 0xffffffff;
      do {
        uVar16 = uVar16 + 1;
        cVar1 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar1 != '\0');
      *(uint *)(lVar24 + 0x90) = uVar16 & 0x3fffffff;
      *(undefined2 *)(lVar24 + 0x96) = 0x103;
      pMVar31 = (Mem *)(lVar24 + 0xa8);
      if (pbVar32[1] == 0xee) {
        if ((int)uVar12 < 1) {
          pMVar18 = (Mem *)0x0;
        }
        else {
          pMVar17 = (Mem *)0x0;
          do {
            pMVar18 = pMVar17;
            if (plVar13[(long)pMVar17] == *(long *)(pbVar32 + 0x10)) break;
            pMVar17 = (Mem *)((long)&pMVar17->db + 1);
            pMVar18 = local_180;
          } while (local_180 != pMVar17);
        }
        if ((uint)pMVar18 == uVar12) {
          iVar11 = uVar12 * 8 + 8;
          local_190 = (Mem *)CONCAT44((int)((ulong)pMVar27 >> 0x20),iVar11);
          iVar11 = sqlite3VdbeMemGrow(local_188,iVar11,(uint)(local_180 != (Mem *)0x0));
          if (iVar11 == 0) {
            *(undefined8 *)(pMVar9->z + (long)(int)local_180 * 8) = *(undefined8 *)(pbVar32 + 0x10);
            *(byte *)&pMVar9->flags = (byte)pMVar9->flags | 0x10;
            pMVar9->n = (int)local_190;
          }
        }
      }
    }
    pMVar31->flags = 4;
    pMVar31->u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar32 + 4);
    pMVar31->type = '\x01';
    pMVar31[1].flags = 4;
    pMVar31[1].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar32 + 8);
    pMVar31[1].type = '\x01';
    pMVar31[2].flags = 4;
    pMVar31[2].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar32 + 0xc);
    pMVar31[2].type = '\x01';
    pMVar27 = pMVar31 + 3;
    local_160 = pbVar32;
    iVar11 = sqlite3VdbeMemGrow(pMVar27,0x20,0);
    uVar12 = 1;
    if (iVar11 != 0) goto LAB_0014d5f4;
    pMVar31[3].flags = 0x602;
    pcVar14 = pMVar31[3].z;
    pcVar22 = pcVar14;
    local_190 = pMVar31;
    local_180 = pMVar27;
    switch(local_160[1]) {
    case 0xed:
switchD_0014da64_caseD_ed:
      *pcVar14 = '\0';
      pcVar22 = pcVar14;
      break;
    case 0xee:
      pcVar22 = "program";
      goto LAB_0014dc59;
    case 0xef:
    case 0xfa:
      local_170 = *(long *)(local_160 + 0x10);
      uVar16 = 0;
      local_168 = pcVar14;
      sqlite3_snprintf(0x20,pcVar14,"keyinfo(%d",(ulong)*(ushort *)(local_170 + 10));
      if (local_168 != (char *)0x0) {
        uVar16 = 0xffffffff;
        pcVar14 = local_168;
        do {
          uVar16 = uVar16 + 1;
          cVar1 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar1 != '\0');
        uVar16 = uVar16 & 0x3fffffff;
      }
      pcVar22 = local_168;
      if (*(short *)(local_170 + 10) != 0) {
        pMVar27 = (Mem *)0x0;
        lVar24 = local_170;
        do {
          puVar6 = *(undefined8 **)(lVar24 + 0x18 + (long)pMVar27 * 8);
          pcVar14 = "nil";
          if (puVar6 != (undefined8 *)0x0) {
            pcVar14 = (char *)*puVar6;
          }
          if (pcVar14 == (char *)0x0) {
            uVar23 = 0;
          }
          else {
            uVar23 = 0xffffffff;
            pcVar21 = pcVar14;
            do {
              uVar23 = uVar23 + 1;
              cVar1 = *pcVar21;
              pcVar21 = pcVar21 + 1;
            } while (cVar1 != '\0');
            uVar23 = uVar23 & 0x3fffffff;
          }
          iVar11 = uVar23 + uVar16;
          uVar28 = (ulong)uVar16;
          if (iVar11 < 0x1b) {
            pcVar22[uVar28] = ',';
            if (*(char *)((long)&pMVar27->db + *(long *)(lVar24 + 0x10)) == '\0') {
              uVar16 = (uint)(uVar28 + 1);
            }
            else {
              uVar16 = uVar16 + 2;
              pcVar22[uVar28 + 1] = '-';
            }
            local_188 = pMVar27;
            local_174 = iVar11;
            memcpy(pcVar22 + uVar16,pcVar14,(ulong)(uVar23 + 1));
            uVar16 = uVar16 + uVar23;
            lVar24 = local_170;
            pcVar22 = local_168;
            pMVar27 = local_188;
            iVar11 = local_174;
          }
          else {
            builtin_strncpy(pcVar22 + uVar28,",...",4);
          }
        } while ((iVar11 < 0x1b) &&
                (pMVar27 = (Mem *)((long)&pMVar27->db + 1),
                pMVar27 < (Mem *)(ulong)*(ushort *)(lVar24 + 10)));
      }
      (pcVar22 + uVar16)[0] = ')';
      (pcVar22 + uVar16)[1] = '\0';
      break;
    default:
      pcVar22 = *(char **)(local_160 + 0x10);
      if (*(char **)(local_160 + 0x10) == (char *)0x0) goto switchD_0014da64_caseD_ed;
      break;
    case 0xf1:
      pcVar22 = "intarray";
LAB_0014dc59:
      sqlite3_snprintf(0x20,pcVar14,pcVar22);
      pcVar22 = pcVar14;
      break;
    case 0xf2:
      sqlite3_snprintf(0x20,pcVar14,"%d",(ulong)*(uint *)(local_160 + 0x10));
      break;
    case 0xf3:
      uVar19 = **(undefined8 **)(local_160 + 0x10);
LAB_0014dbf8:
      pcVar21 = "%lld";
      goto LAB_0014dc07;
    case 0xf4:
      uVar19 = **(undefined8 **)(local_160 + 0x10);
LAB_0014dc2f:
      sqlite3_snprintf(0x20,pcVar14,"%.16g",uVar19);
      break;
    case 0xf6:
      sqlite3_snprintf(0x20,pcVar14,"vtab:%p:%p");
      break;
    case 0xf8:
      lVar24 = *(long *)(local_160 + 0x10);
      uVar15 = *(ushort *)(lVar24 + 0x24);
      if ((uVar15 & 2) == 0) {
        if ((uVar15 & 4) != 0) {
          uVar19 = *(undefined8 *)(lVar24 + 0x18);
          goto LAB_0014dbf8;
        }
        if ((uVar15 & 8) != 0) {
          uVar19 = *(undefined8 *)(lVar24 + 0x10);
          goto LAB_0014dc2f;
        }
        pcVar22 = "(blob)";
        if ((uVar15 & 1) != 0) {
          pcVar22 = "NULL";
          goto LAB_0014dc59;
        }
      }
      else {
        pcVar22 = *(char **)(lVar24 + 8);
      }
      break;
    case 0xfb:
      sqlite3_snprintf(0x20,pcVar14,"%s(%d)",*(undefined8 *)(*(long *)(local_160 + 0x10) + 0x30));
      break;
    case 0xfc:
      uVar19 = **(undefined8 **)(local_160 + 0x10);
      pcVar21 = "collseq(%.20s)";
LAB_0014dc07:
      sqlite3_snprintf(0x20,pcVar14,pcVar21,uVar19);
    }
    pcVar14 = local_190[3].z;
    if (pcVar22 == pcVar14) {
      if (pcVar14 == (char *)0x0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0xffffffff;
        do {
          uVar16 = uVar16 + 1;
          cVar1 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar1 != '\0');
        uVar16 = uVar16 & 0x3fffffff;
      }
      local_190[3].n = uVar16;
      local_190[3].enc = '\x01';
    }
    else {
      sqlite3VdbeMemSetStr(local_180,pcVar22,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    pMVar27 = local_190;
    local_190[3].type = '\x03';
    if ((*(ushort *)(pStmt + 0x9a) & 3) == 1) {
      iVar11 = sqlite3VdbeMemGrow(local_190 + 4,4,0);
      if (iVar11 == 0) {
        pMVar27[4].flags = 0x602;
        pMVar27[4].n = 2;
        sqlite3_snprintf(3,pMVar27[4].z,"%.2x");
        pMVar27[4].type = '\x03';
        pMVar27[4].enc = '\x01';
        pMVar27[5].flags = 1;
        pMVar27[5].type = '\x05';
        goto LAB_0014ddad;
      }
    }
    else {
LAB_0014ddad:
      *(ushort *)(pStmt + 0x48) = (~*(ushort *)(pStmt + 0x9a) & 3) << 2;
      *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
      *(undefined4 *)(pStmt + 0x94) = 0;
      uVar12 = 100;
    }
LAB_0014d5f4:
    if (uVar12 != 100) {
      if (((puVar2[0x19] != 0) && (*(char *)((long)puVar2 + 0x99) == '\0')) &&
         (*(long *)(pStmt + 0xd0) != 0)) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,local_140);
        (*(code *)puVar2[0x19])
                  (puVar2[0x1a],*(undefined8 *)(pStmt + 0xd0),
                   (local_140[0] - *(long *)(pStmt + 0xb8)) * 1000000);
      }
      if (uVar12 == 0x65) {
        if (*(int *)(puVar2 + 5) < 1) {
          iVar11 = 0;
        }
        else {
          lVar24 = 0;
          lVar30 = 8;
          iVar11 = 0;
          do {
            lVar3 = puVar2[4];
            lVar29 = *(long *)(lVar3 + lVar30);
            if (lVar29 != 0) {
              lVar29 = *(long *)(**(long **)(lVar29 + 8) + 0x118);
              if (lVar29 == 0) {
                iVar26 = 0;
              }
              else {
                iVar26 = *(int *)(lVar29 + 0x18);
                *(undefined4 *)(lVar29 + 0x18) = 0;
              }
              if ((((code *)puVar2[0x21] != (code *)0x0) && (0 < iVar26)) && (iVar11 == 0)) {
                iVar11 = (*(code *)puVar2[0x21])
                                   (puVar2[0x22],puVar2,*(undefined8 *)(lVar3 + -8 + lVar30));
              }
            }
            lVar24 = lVar24 + 1;
            lVar30 = lVar30 + 0x20;
          } while (lVar24 < *(int *)(puVar2 + 5));
        }
        *(int *)(pStmt + 0x94) = iVar11;
        uVar12 = 1;
        if (iVar11 == 0) {
          uVar12 = 0x65;
        }
      }
    }
    *(uint *)((long)puVar2 + 0x44) = uVar12;
    iVar11 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x94));
    if (iVar11 == 7) {
      *(undefined4 *)(pStmt + 0x94) = 7;
    }
LAB_0014d714:
    if ((uVar12 - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x9a) & 0x200) != 0)) {
      uVar12 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    uVar12 = uVar12 & *(uint *)(puVar2 + 9);
LAB_0014d73b:
    uVar16 = 0;
    if (uVar12 != 0x11) goto LAB_0014de1f;
    if (iVar10 != 0x32) {
      if ((pStmt == (sqlite3_stmt *)0x0) || (((byte)pStmt[0x9b] & 2) == 0)) {
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = *(char **)(pStmt + 0xd0);
      }
      psVar4 = *(sqlite3 **)pStmt;
      uVar12 = sqlite3LockAndPrepare
                         (psVar4,pcVar14,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_198,(char **)0x0
                         );
      pFromStmt = local_198;
      if (uVar12 == 0) {
        memcpy(local_140,local_198,0x110);
        memcpy(pFromStmt,pStmt,0x110);
        memcpy(pStmt,local_140,0x110);
        pVVar5 = pFromStmt->pNext;
        pFromStmt->pNext = *(Vdbe **)(pStmt + 0x68);
        *(Vdbe **)(pStmt + 0x68) = pVVar5;
        pVVar5 = pFromStmt->pPrev;
        pFromStmt->pPrev = *(Vdbe **)(pStmt + 0x60);
        *(Vdbe **)(pStmt + 0x60) = pVVar5;
        pcVar14 = pFromStmt->zSql;
        pFromStmt->zSql = *(char **)(pStmt + 0xd0);
        *(char **)(pStmt + 0xd0) = pcVar14;
        *(ushort *)(pStmt + 0x9a) =
             *(ushort *)(pStmt + 0x9a) & 0xfdff | *(ushort *)&pFromStmt->field_0x9a & 0x200;
        sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,pStmt);
        local_198->rc = 0;
        sqlite3VdbeFinalize(local_198);
        uVar12 = 0;
      }
      else if (uVar12 == 7) {
        psVar4->mallocFailed = '\x01';
      }
      uVar16 = uVar12;
      if (uVar12 != 0) goto LAB_0014de1f;
      iVar10 = iVar10 + 1;
      sqlite3_reset(pStmt);
      uVar15 = *(ushort *)(pStmt + 0x9a) | 0x400;
      goto LAB_0014d3a1;
    }
    uVar12 = 0x11;
LAB_0014de1f:
    psVar4 = local_158;
    if (((uVar16 != 0) && (((byte)pStmt[0x9b] & 2) != 0)) &&
       (local_158->pErr != (sqlite3_value *)0x0)) {
      pcVar14 = (char *)sqlite3ValueText(local_158->pErr,'\x01');
      sqlite3DbFree(psVar4,*(void **)(pStmt + 0x58));
      if (psVar4->mallocFailed == '\0') {
        pcVar14 = sqlite3DbStrDup(psVar4,pcVar14);
      }
      else {
        uVar16 = 7;
        pcVar14 = (char *)0x0;
        uVar12 = 7;
      }
      *(char **)(pStmt + 0x58) = pcVar14;
      *(uint *)(pStmt + 0x94) = uVar16;
    }
    iVar10 = sqlite3ApiExit(psVar4,uVar12);
    if (psVar4->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar4->mutex);
    }
  }
  else {
    iVar10 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0xf8b5,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  return iVar10;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY
         && (rc2 = rc = sqlite3Reprepare(v))==SQLITE_OK ){
    sqlite3_reset(pStmt);
    v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK && ALWAYS(v->isPrepareV2) && ALWAYS(db->pErr) ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}